

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::FloatStateQueryTests::init(FloatStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  GetBooleanVerifier *pGVar3;
  undefined4 extraout_var;
  GetIntegerVerifier *pGVar4;
  undefined4 extraout_var_00;
  GetInteger64Verifier *pGVar5;
  undefined4 extraout_var_01;
  GetFloatVerifier *pGVar6;
  undefined4 extraout_var_02;
  long *plVar7;
  ApiCase *pAVar8;
  long *plVar9;
  long lVar10;
  StateVerifier *verifiers [4];
  long *local_a0;
  long local_90;
  long lStack_88;
  long *local_80 [2];
  long local_70 [2];
  ApiCase *local_60;
  GetBooleanVerifier *local_58;
  GetIntegerVerifier *local_50;
  GetInteger64Verifier *local_48;
  GetFloatVerifier *local_40;
  
  pGVar3 = (GetBooleanVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar3->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar3->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar3->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar3->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d323c8;
  this->m_verifierBoolean = pGVar3;
  pGVar4 = (GetIntegerVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar4->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar4->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar4->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar4->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d32418;
  this->m_verifierInteger = pGVar4;
  pGVar5 = (GetInteger64Verifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar5->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar5->super_StateVerifier).m_testNamePostfix = "_getinteger64";
  (pGVar5->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar5->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d32468;
  this->m_verifierInteger64 = pGVar5;
  pGVar6 = (GetFloatVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar6->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_02,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar6->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar6->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar6->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d324b8;
  this->m_verifierFloat = pGVar6;
  local_58 = this->m_verifierBoolean;
  local_50 = this->m_verifierInteger;
  local_48 = this->m_verifierInteger64;
  local_40 = pGVar6;
  lVar10 = 0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[lVar10];
    local_60 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"depth_range","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    pAVar8 = local_60;
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(local_60,pCVar1,(char *)local_a0,"DEPTH_RANGE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d325e0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"line_width","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"LINE_WIDTH");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d32638;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"polygon_offset_factor","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"POLYGON_OFFSET_FACTOR");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d32690;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"polygon_offset_units","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"POLYGON_OFFSET_UNITS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d326e8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"sample_coverage_value","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"SAMPLE_COVERAGE_VALUE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d32740;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"blend_color","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"BLEND_COLOR");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d32798;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"color_clear_value","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"COLOR_CLEAR_VALUE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d327f0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"depth_clear_value","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"DEPTH_CLEAR_VALUE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d32848;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"max_texture_lod_bias","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"MAX_TEXTURE_LOD_BIAS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d328a0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"aliased_point_size_range","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"ALIASED_POINT_SIZE_RANGE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d328f8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  local_60 = (ApiCase *)0x0;
  do {
    local_a0 = &local_90;
    pGVar3 = (&local_58)[(long)local_60];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"aliased_line_width_range","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_90 = *plVar9;
      lStack_88 = plVar7[3];
    }
    else {
      local_90 = *plVar9;
      local_a0 = (long *)*plVar7;
    }
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar1,(char *)local_a0,"ALIASED_LINE_WIDTH_RANGE");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d32950;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar8);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    local_60 = (ApiCase *)((long)local_60 + 1);
  } while (local_60 != (ApiCase *)0x4);
  return 4;
}

Assistant:

void FloatStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	FOR_EACH_VERIFIER(verifiers, addChild(new DepthRangeCase				(m_context, verifier,	(std::string("depth_range")					+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new LineWidthCase					(m_context, verifier,	(std::string("line_width")					+ verifier->getTestNamePostfix()).c_str(),	"LINE_WIDTH")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetFactorCase		(m_context, verifier,	(std::string("polygon_offset_factor")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_FACTOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetUnitsCase		(m_context, verifier,	(std::string("polygon_offset_units")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_UNITS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new SampleCoverageCase			(m_context, verifier,	(std::string("sample_coverage_value")		+ verifier->getTestNamePostfix()).c_str(),	"SAMPLE_COVERAGE_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new BlendColorCase				(m_context, verifier,	(std::string("blend_color")					+ verifier->getTestNamePostfix()).c_str(),	"BLEND_COLOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new ColorClearCase				(m_context, verifier,	(std::string("color_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"COLOR_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new DepthClearCase				(m_context, verifier,	(std::string("depth_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new MaxTextureLODBiasCase			(m_context, verifier,	(std::string("max_texture_lod_bias")		+ verifier->getTestNamePostfix()).c_str(),	"MAX_TEXTURE_LOD_BIAS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedPointSizeRangeCase		(m_context, verifier,	(std::string("aliased_point_size_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_POINT_SIZE_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedLineWidthRangeCase		(m_context, verifier,	(std::string("aliased_line_width_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_LINE_WIDTH_RANGE")));
}